

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

real __thiscall fasttext::DenseMatrix::l2NormRow(DenseMatrix *this,int64_t i)

{
  uint uVar1;
  real *prVar2;
  undefined8 uVar3;
  long in_RDI;
  double dVar4;
  int j;
  double norm;
  undefined4 in_stack_ffffffffffffffc0;
  real in_stack_ffffffffffffffc4;
  DenseMatrix *in_stack_ffffffffffffffd0;
  int local_1c;
  double local_18;
  
  local_18 = 0.0;
  for (local_1c = 0; (long)local_1c < *(long *)(in_RDI + 0x10); local_1c = local_1c + 1) {
    prVar2 = at(in_stack_ffffffffffffffd0,in_RDI,
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    in_stack_ffffffffffffffc4 = *prVar2;
    prVar2 = at(in_stack_ffffffffffffffd0,in_RDI,
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    local_18 = (double)(in_stack_ffffffffffffffc4 * *prVar2) + local_18;
  }
  uVar1 = std::isnan(local_18);
  if ((uVar1 & 1) == 0) {
    dVar4 = sqrt(local_18);
    return (float)dVar4;
  }
  uVar3 = __cxa_allocate_exception(0x10);
  EncounteredNaNError::EncounteredNaNError
            ((EncounteredNaNError *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  __cxa_throw(uVar3,&EncounteredNaNError::typeinfo,EncounteredNaNError::~EncounteredNaNError);
}

Assistant:

real DenseMatrix::l2NormRow(int64_t i) const {
  auto norm = 0.0;
  for (auto j = 0; j < n_; j++) {
    norm += at(i, j) * at(i, j);
  }
  if (std::isnan(norm)) {
    throw EncounteredNaNError();
  }
  return std::sqrt(norm);
}